

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Swap.cpp
# Opt level: O0

void __thiscall
OpenMD::RNEMD::SwapMethod::SwapMethod(SwapMethod *this,SimInfo *info,ForceManager *forceMan)

{
  RNEMD *pRVar1;
  bool bVar2;
  Globals *this_00;
  undefined8 uVar3;
  reference pvVar4;
  SimInfo *in_RSI;
  RNEMD *in_RDI;
  RealType kineticFlux;
  RNEMD *this_01;
  vector<double,_std::allocator<double>_> momentumFluxVector;
  RealType momentumFlux;
  bool hasCorrectFlux;
  bool methodFluxMismatch;
  bool hasMomentumFlux;
  bool hasKineticFlux;
  RNEMDParameters *rnemdParams;
  ForceManager *in_stack_00001590;
  SimInfo *in_stack_00001598;
  RNEMD *in_stack_000015a0;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  RNEMDFluxType RVar5;
  vector<double,_std::allocator<double>_> *momentumFluxVector_00;
  undefined1 local_59 [25];
  RNEMD *local_40;
  bool local_34;
  char local_33;
  byte local_32;
  byte local_31;
  RNEMDParameters *local_30;
  SimInfo *local_10;
  
  local_10 = in_RSI;
  RNEMD::RNEMD(in_stack_000015a0,in_stack_00001598,in_stack_00001590);
  in_RDI->_vptr_RNEMD = (_func_int **)&PTR__SwapMethod_00512ac0;
  std::__cxx11::string::operator=((string *)&in_RDI->rnemdMethodLabel_,"Swap");
  this_00 = SimInfo::getSimParams(local_10);
  local_30 = Globals::getRNEMDParameters(this_00);
  local_31 = RNEMDParameters::haveKineticFlux((RNEMDParameters *)0x408e84);
  local_32 = RNEMDParameters::haveMomentumFlux((RNEMDParameters *)0x408ea4);
  local_33 = '\0';
  local_34 = false;
  if (in_RDI->rnemdFluxType_ == rnemdKE) {
    bVar2 = (bool)(local_31 & 1);
  }
  else {
    bVar2 = (bool)local_32;
    if (2 < in_RDI->rnemdFluxType_ - rnemdPx) {
      local_33 = '\x01';
      bVar2 = local_34;
    }
  }
  local_34 = bVar2;
  if (local_33 != '\0') {
    uVar3 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "RNEMD: The current method,\n\t\tSwap\n\tcannot be used with the current flux type, %s\n"
             ,uVar3);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  if ((local_34 & 1U) == 0) {
    uVar3 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "RNEMD: The current method, Swap, and flux type, %s,\n\tdid not have the correct flux value specified. Options\n\tinclude: kineticFlux and momentumFlux.\n"
             ,uVar3);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  if ((local_31 & 1) == 0) {
    RNEMD::setKineticFlux(in_RDI,0.0);
  }
  else {
    kineticFlux = RNEMDParameters::getKineticFlux((RNEMDParameters *)0x409005);
    RNEMD::setKineticFlux(in_RDI,kineticFlux);
  }
  if ((local_32 & 1) != 0) {
    this_01 = (RNEMD *)RNEMDParameters::getMomentumFlux((RNEMDParameters *)0x40904d);
    momentumFluxVector_00 = (vector<double,_std::allocator<double>_> *)local_59;
    local_40 = this_01;
    std::allocator<double>::allocator((allocator<double> *)0x409073);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)this_01,(size_type)momentumFluxVector_00,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    std::allocator<double>::~allocator((allocator<double> *)0x409093);
    pRVar1 = local_40;
    RVar5 = in_RDI->rnemdFluxType_;
    if (RVar5 == rnemdPx) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_59 + 1),0);
      *pvVar4 = (value_type)pRVar1;
    }
    else if (RVar5 == rnemdPy) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_59 + 1),1);
      *pvVar4 = (value_type)pRVar1;
    }
    else if (RVar5 == rnemdPz) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_59 + 1),2);
      *pvVar4 = (value_type)pRVar1;
    }
    RNEMD::setMomentumFluxVector(this_01,momentumFluxVector_00);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)CONCAT44(RVar5,in_stack_ffffffffffffff50))
    ;
  }
  return;
}

Assistant:

SwapMethod::SwapMethod(SimInfo* info, ForceManager* forceMan) :
      RNEMD {info, forceMan} {
    rnemdMethodLabel_ = "Swap";

    RNEMDParameters* rnemdParams = info->getSimParams()->getRNEMDParameters();

    bool hasKineticFlux  = rnemdParams->haveKineticFlux();
    bool hasMomentumFlux = rnemdParams->haveMomentumFlux();

    bool methodFluxMismatch = false;
    bool hasCorrectFlux     = false;

    switch (rnemdFluxType_) {
    case rnemdKE:
      hasCorrectFlux = hasKineticFlux;
      break;
    case rnemdPx:
    case rnemdPy:
    case rnemdPz:
      hasCorrectFlux = hasMomentumFlux;
      break;
    default:
      methodFluxMismatch = true;
      break;
    }

    if (methodFluxMismatch) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: The current method,\n"
               "\t\tSwap\n"
               "\tcannot be used with the current flux type, %s\n",
               rnemdFluxTypeLabel_.c_str());
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (!hasCorrectFlux) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: The current method, Swap, and flux type, %s,\n"
               "\tdid not have the correct flux value specified. Options\n"
               "\tinclude: kineticFlux and momentumFlux.\n",
               rnemdFluxTypeLabel_.c_str());
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (hasKineticFlux) {
      setKineticFlux(rnemdParams->getKineticFlux());
    } else {
      setKineticFlux(0.0);
    }

    if (hasMomentumFlux) {
      RealType momentumFlux = rnemdParams->getMomentumFlux();
      std::vector<RealType> momentumFluxVector(3);

      switch (rnemdFluxType_) {
      case rnemdPx:
        momentumFluxVector[0] = momentumFlux;
        break;
      case rnemdPy:
        momentumFluxVector[1] = momentumFlux;
        break;
      case rnemdPz:
        momentumFluxVector[2] = momentumFlux;
        break;
      default:
        break;
      }

      setMomentumFluxVector(momentumFluxVector);
    }
  }